

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListEnlarge(Parse *pParse,SrcList *pSrc,int nExtra,int iStart)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  SrcList *pSVar5;
  SrcItem *pSVar6;
  uint uVar7;
  long lVar8;
  undefined4 *puVar9;
  SrcItem *pSVar10;
  ulong uVar11;
  SrcItem *pSVar12;
  SrcItem *pSVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  
  bVar17 = 0;
  uVar7 = pSrc->nSrc + nExtra;
  lVar16 = (long)nExtra;
  if (pSrc->nAlloc < uVar7) {
    if ((int)uVar7 < 200) {
      lVar14 = lVar16 + (long)pSrc->nSrc * 2;
      lVar15 = 200;
      if (lVar14 < 200) {
        lVar15 = lVar14;
      }
      pSVar5 = (SrcList *)sqlite3DbRealloc(pParse->db,pSrc,lVar15 * 0x48 + 8);
      if (pSVar5 == (SrcList *)0x0) {
        bVar1 = false;
      }
      else {
        pSVar5->nAlloc = (u32)lVar15;
        bVar1 = true;
        pSrc = pSVar5;
      }
    }
    else {
      bVar1 = false;
      sqlite3ErrorMsg(pParse,"too many FROM clause terms, max: %d",200);
    }
    if (!bVar1) {
      return (SrcList *)0x0;
    }
  }
  lVar14 = (long)pSrc->nSrc;
  lVar15 = (long)iStart;
  if (iStart < pSrc->nSrc) {
    pSVar6 = pSrc->a + lVar14 + -1;
    pSVar10 = pSrc->a + lVar14 + lVar16 + -1;
    do {
      lVar14 = lVar14 + -1;
      pSVar12 = pSVar6;
      pSVar13 = pSVar10;
      for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
        pSVar13->zName = pSVar12->zName;
        pSVar12 = (SrcItem *)((long)pSVar12 + ((ulong)bVar17 * -2 + 1) * 8);
        pSVar13 = (SrcItem *)((long)pSVar13 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      pSVar6 = pSVar6 + -1;
      pSVar10 = pSVar10 + -1;
    } while (lVar15 < lVar14);
  }
  pSrc->nSrc = pSrc->nSrc + nExtra;
  memset(pSrc->a + lVar15,0,lVar16 * 0x48);
  auVar4 = _DAT_002010a0;
  auVar3 = _DAT_00201090;
  auVar2 = _DAT_00201080;
  if (0 < nExtra) {
    lVar16 = (long)(nExtra + iStart);
    if ((long)(nExtra + iStart) < lVar15 + 1) {
      lVar16 = lVar15 + 1;
    }
    lVar14 = (lVar16 - lVar15) + -1;
    auVar18._8_4_ = (int)lVar14;
    auVar18._0_8_ = lVar14;
    auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
    puVar9 = (undefined4 *)((long)&pSrc[3].a[lVar15].zName + 4);
    uVar11 = 0;
    auVar18 = auVar18 ^ _DAT_002010a0;
    do {
      auVar20._8_4_ = (int)uVar11;
      auVar20._0_8_ = uVar11;
      auVar20._12_4_ = (int)(uVar11 >> 0x20);
      auVar21 = (auVar20 | auVar3) ^ auVar4;
      iVar19 = auVar18._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar19 && auVar18._0_4_ < auVar21._0_4_ ||
                  iVar19 < auVar21._4_4_) & 1)) {
        puVar9[-0x36] = 0xffffffff;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        puVar9[-0x24] = 0xffffffff;
      }
      auVar20 = (auVar20 | auVar2) ^ auVar4;
      iVar22 = auVar20._4_4_;
      if (iVar22 <= iVar19 && (iVar22 != iVar19 || auVar20._0_4_ <= auVar18._0_4_)) {
        puVar9[-0x12] = 0xffffffff;
        *puVar9 = 0xffffffff;
      }
      uVar11 = uVar11 + 4;
      puVar9 = puVar9 + 0x48;
    } while (((lVar16 - lVar15) + 3U & 0xfffffffffffffffc) != uVar11);
  }
  return pSrc;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  Parse *pParse,     /* Parsing context into which errors are reported */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    sqlite3_int64 nAlloc = 2*(sqlite3_int64)pSrc->nSrc+nExtra;
    sqlite3 *db = pParse->db;

    if( pSrc->nSrc+nExtra>=SQLITE_MAX_SRCLIST ){
      sqlite3ErrorMsg(pParse, "too many FROM clause terms, max: %d",
                      SQLITE_MAX_SRCLIST);
      return 0;
    }
    if( nAlloc>SQLITE_MAX_SRCLIST ) nAlloc = SQLITE_MAX_SRCLIST;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return 0;
    }
    pSrc = pNew;
    pSrc->nAlloc = nAlloc;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}